

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linkedlist.h
# Opt level: O1

void __thiscall LinkList<Statistic>::Delete(LinkList<Statistic> *this,int which)

{
  InternalNode **ppIVar1;
  InternalNode *pIVar2;
  InternalNode *pIVar3;
  char *pcVar4;
  InternalNode *pIVar5;
  int iVar6;
  
  if (which == 0) {
    return;
  }
  if (this->iLength < which) {
    return;
  }
  ppIVar1 = &this->pnHead;
  pIVar5 = this->pnHead;
  if (1 < which) {
    iVar6 = which + -1;
    do {
      pIVar5 = pIVar5->next;
      iVar6 = iVar6 + -1;
    } while (iVar6 != 0);
  }
  if (pIVar5 == *ppIVar1) {
    pIVar2 = pIVar5->next;
    if (pIVar2 == (InternalNode *)0x0) {
LAB_00106d40:
      if (pIVar5 != (InternalNode *)0x0) {
        pcVar4 = (pIVar5->Data).psKey;
        if (pcVar4 != (char *)0x0) {
          operator_delete__(pcVar4);
        }
        operator_delete(pIVar5);
      }
      this->iLength = 0;
      *ppIVar1 = (InternalNode *)0x0;
      this->pnTail = (InternalNode *)0x0;
      this->pnLastRef = (InternalNode *)0x0;
      this->iLastRef = -1;
      goto LAB_00106d76;
    }
    *ppIVar1 = pIVar2;
    pIVar2->previous = (InternalNode *)0x0;
    if (pIVar5 != (InternalNode *)0x0) {
      pcVar4 = (pIVar5->Data).psKey;
      if (pcVar4 != (char *)0x0) {
        operator_delete__(pcVar4);
      }
      operator_delete(pIVar5);
    }
    pIVar5 = this->pnHead;
  }
  else {
    if (pIVar5 != this->pnTail) {
      pIVar2 = pIVar5->next;
      this->pnLastRef = pIVar2;
      pIVar3 = pIVar5->previous;
      pIVar3->next = pIVar2;
      pIVar5->next->previous = pIVar3;
      if (pIVar5 != (InternalNode *)0x0) {
        pcVar4 = (pIVar5->Data).psKey;
        if (pcVar4 != (char *)0x0) {
          operator_delete__(pcVar4);
        }
        operator_delete(pIVar5);
      }
      goto LAB_00106d76;
    }
    pIVar2 = pIVar5->previous;
    if (pIVar2 == (InternalNode *)0x0) goto LAB_00106d40;
    this->pnTail = pIVar2;
    pIVar2->next = (InternalNode *)0x0;
    if (pIVar5 != (InternalNode *)0x0) {
      pcVar4 = (pIVar5->Data).psKey;
      if (pcVar4 != (char *)0x0) {
        operator_delete__(pcVar4);
      }
      operator_delete(pIVar5);
    }
    pIVar5 = this->pnTail;
  }
  this->pnLastRef = pIVar5;
LAB_00106d76:
  if (this->iLength != 0) {
    this->iLength = this->iLength + -1;
  }
  return;
}

Assistant:

inline void LinkList<T>::Delete(int which)
{
   if (which>iLength || which == 0)
      return;

   InternalNode *pnDeleteMe = pnHead;

   for (int i=1; i<which; i++)
      pnDeleteMe = pnDeleteMe->next;

   if (pnDeleteMe == pnHead)
   {
      if (pnDeleteMe->next == NULL)
      {
         delete pnDeleteMe;
         SetNull();
      }
      else
      {
         pnHead = pnDeleteMe->next;
         pnHead->previous = NULL;
         delete pnDeleteMe;
         pnLastRef = pnHead;
      }
   }
   else
   {
      if (pnDeleteMe == pnTail)
      {
         if (pnDeleteMe->previous == NULL)
         {
            delete pnDeleteMe;
            SetNull();
         }
         else
         {
            pnTail = pnDeleteMe->previous;
            pnTail->next = NULL;
            delete pnDeleteMe;
            pnLastRef = pnTail;
         }
      }
      else
      {
         pnLastRef = pnDeleteMe->next;
         pnDeleteMe->previous->next = pnDeleteMe->next;
         pnDeleteMe->next->previous = pnDeleteMe->previous;
         delete pnDeleteMe;
      }
   }

   if (iLength!=0)
      --iLength;
}